

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ev_dfg.c
# Opt level: O0

void handle_flush_reconfig(EVmaster master,EVmaster_msg_ptr mmsg)

{
  FILE *__stream;
  int iVar1;
  __pid_t _Var2;
  pthread_t pVar3;
  undefined8 uVar4;
  long in_RSI;
  long *in_RDI;
  CManager unaff_retaddr;
  timespec ts;
  EVdfg dfg;
  int j;
  int i;
  EVflush_attrs_reconfig_ptr msg;
  __time_t local_38;
  undefined4 in_stack_ffffffffffffffd0;
  int in_stack_ffffffffffffffd4;
  char *file;
  int in_stack_ffffffffffffffe0;
  
  file = (char *)in_RDI[5];
  iVar1 = CManager_locked((CManager)*in_RDI);
  if (iVar1 == 0) {
    __assert_fail("CManager_locked(master->cm)",
                  "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/EVPath/EVPath/ev_dfg.c"
                  ,0x4ac,"void handle_flush_reconfig(EVmaster, EVmaster_msg_ptr)");
  }
  if (*(int *)(in_RSI + 0x10) != 0) {
    *(undefined4 *)(in_RDI + 6) = 3;
  }
  iVar1 = CMtrace_val[0xd];
  if (*(long *)(*in_RDI + 0x120) == 0) {
    iVar1 = CMtrace_init(unaff_retaddr,(CMTraceType)((ulong)in_RDI >> 0x20));
  }
  if (iVar1 != 0) {
    if (CMtrace_PID != 0) {
      __stream = *(FILE **)(*in_RDI + 0x120);
      _Var2 = getpid();
      pVar3 = pthread_self();
      fprintf(__stream,"P%lxT%lx - ",(long)_Var2,pVar3);
    }
    if (CMtrace_timing != 0) {
      clock_gettime(1,(timespec *)&local_38);
      fprintf(*(FILE **)(*in_RDI + 0x120),"%lld.%.9ld - ",local_38,
              CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
    }
    fprintf(*(FILE **)(*in_RDI + 0x120),"EVDFG flush_attr_reconfig -  master DFG state is now %s\n",
            str_state[*(uint *)(in_RDI + 6)]);
  }
  fflush(*(FILE **)(*in_RDI + 0x120));
  iVar1 = 0;
  do {
    if (*(long *)(in_RSI + 0x18) <= (long)iVar1) {
      if (*(int *)(in_RSI + 0x10) != 0) {
        IntCManager_unlock((CManager)CONCAT44(iVar1,in_stack_ffffffffffffffe0),file,
                           in_stack_ffffffffffffffd4);
        (*(code *)in_RDI[3])(in_RDI[5]);
        IntCManager_lock((CManager)CONCAT44(iVar1,in_stack_ffffffffffffffe0),file,
                         in_stack_ffffffffffffffd4);
        *(undefined4 *)(in_RDI + 10) = 1;
        *(undefined4 *)(in_RDI + 0xb) = 1;
        check_all_nodes_registered
                  ((EVmaster)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
      }
      return;
    }
    for (in_stack_ffffffffffffffe0 = 0; in_stack_ffffffffffffffe0 < *(int *)(file + 0x10);
        in_stack_ffffffffffffffe0 = in_stack_ffffffffffffffe0 + 1) {
      if ((long)*(int *)(*(long *)(*(long *)(*(long *)(file + 0x30) + 8) +
                                  (long)in_stack_ffffffffffffffe0 * 8) + 8) ==
          *(long *)(*(long *)(in_RSI + 0x20) + (long)iVar1 * 0x10)) {
        if (*(long *)(*(long *)(*(long *)(*(long *)(file + 0x30) + 8) +
                               (long)in_stack_ffffffffffffffe0 * 8) + 0x10) != 0) {
          free_attr_list(*(undefined8 *)
                          (*(long *)(*(long *)(*(long *)(file + 0x30) + 8) +
                                    (long)in_stack_ffffffffffffffe0 * 8) + 0x10));
        }
        uVar4 = attr_list_from_string
                          (*(undefined8 *)(*(long *)(in_RSI + 0x20) + (long)iVar1 * 0x10 + 8));
        *(undefined8 *)
         (*(long *)(*(long *)(*(long *)(file + 0x30) + 8) + (long)in_stack_ffffffffffffffe0 * 8) +
         0x10) = uVar4;
        if (*(long *)(*(long *)(*(long *)(*(long *)(file + 0x38) + 8) +
                               (long)in_stack_ffffffffffffffe0 * 8) + 0x10) != 0) {
          free_attr_list(*(undefined8 *)
                          (*(long *)(*(long *)(*(long *)(file + 0x38) + 8) +
                                    (long)in_stack_ffffffffffffffe0 * 8) + 0x10));
        }
        uVar4 = attr_list_from_string
                          (*(undefined8 *)(*(long *)(in_RSI + 0x20) + (long)iVar1 * 0x10 + 8));
        *(undefined8 *)
         (*(long *)(*(long *)(*(long *)(file + 0x38) + 8) + (long)in_stack_ffffffffffffffe0 * 8) +
         0x10) = uVar4;
        break;
      }
    }
    iVar1 = iVar1 + 1;
  } while( true );
}

Assistant:

static void
handle_flush_reconfig(EVmaster master, EVmaster_msg_ptr mmsg)
{
    EVflush_attrs_reconfig_ptr msg = &mmsg->u.flush_reconfig;
    int i, j;
    EVdfg dfg = master->dfg;
    assert(CManager_locked(master->cm));
    if (((EVflush_attrs_reconfig_ptr)msg)->reconfig) {
	master->state = DFG_Reconfiguring;
    }
    CMtrace_out(master->cm, EVdfgVerbose, "EVDFG flush_attr_reconfig -  master DFG state is now %s\n", str_state[master->state]);
    for (i=0; i < msg->count; i++) {
	/* go through incoming attributes */
	for (j=0; j< dfg->stone_count; j++) {
	    if (dfg->deployed_state->stones[j]->stone_id == msg->attr_stone_list[i].stone) {
		if (dfg->deployed_state->stones[j]->attrs != NULL) {
		    free_attr_list(dfg->deployed_state->stones[j]->attrs);
		}
		dfg->deployed_state->stones[j]->attrs = attr_list_from_string(msg->attr_stone_list[i].attr_str);
		if (dfg->working_state->stones[j]->attrs != NULL) {
		    free_attr_list(dfg->working_state->stones[j]->attrs);
		}
		dfg->working_state->stones[j]->attrs = attr_list_from_string(msg->attr_stone_list[i].attr_str);
		break;
	    }
	}
    }
    if (msg->reconfig) {
	CManager_unlock(master->cm);
	master->node_reconfig_handler(master->dfg);
	CManager_lock(master->cm);
	master->reconfig = 1;
	master->sig_reconfig_bool = 1;
	check_all_nodes_registered(master);
    }
}